

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O0

cueify_msf_t cueify_full_toc_get_point_address(cueify_full_toc *t,uint8_t session,uint8_t point)

{
  cueify_msf_t local_30;
  cueify_msf_t zero;
  cueify_full_toc_private *toc;
  uint8_t point_local;
  uint8_t session_local;
  cueify_full_toc *t_local;
  
  if (t == (cueify_full_toc *)0x0) {
    t_local._5_2_ = 0;
    t_local._7_1_ = '\0';
  }
  else if ((point < *(byte *)((long)t + 2)) || (*(byte *)((long)t + 3) < point)) {
    if ((session < *(byte *)t) || (*(byte *)((long)t + 1) < session)) {
      t_local._5_2_ = 0;
      t_local._7_1_ = '\0';
    }
    else if (point == 0xa0) {
      t_local._5_2_ = *(undefined2 *)((long)t + (ulong)session * 0x21 + 0x39a);
      t_local._7_1_ = *(uint8_t *)((long)t + (ulong)session * 0x21 + 0x39c);
    }
    else if (point == 0xa1) {
      t_local._5_2_ = *(undefined2 *)((long)t + (ulong)session * 0x21 + 0x3a3);
      t_local._7_1_ = *(uint8_t *)((long)t + (ulong)session * 0x21 + 0x3a5);
    }
    else if (point == 0xaa) {
      t_local._5_2_ = *(undefined2 *)((long)t + (ulong)session * 0x21 + 0x391);
      t_local._7_1_ = *(uint8_t *)((long)t + (ulong)session * 0x21 + 0x393);
    }
    else {
      t_local._5_2_ = 0;
      t_local._7_1_ = '\0';
    }
  }
  else {
    t_local._5_2_ = *(undefined2 *)((long)t + (ulong)point * 9 + 7);
    t_local._7_1_ = *(uint8_t *)((long)t + (ulong)point * 9 + 9);
  }
  local_30.frm = t_local._7_1_;
  local_30.min = t_local._5_1_;
  local_30.sec = t_local._6_1_;
  return local_30;
}

Assistant:

cueify_msf_t cueify_full_toc_get_point_address(cueify_full_toc *t,
					       uint8_t session,
					       uint8_t point) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;
    cueify_msf_t zero;

    zero.min = 0;
    zero.sec = 0;
    zero.frm = 0;

    if (toc == NULL) {
	return zero;
    } else if (point >= toc->first_track_number &&
	       point <= toc->last_track_number) {
	return toc->tracks[point].atime;  /* session doesn't actually matter */
    } else if (session >= toc->first_session_number &&
	       session <= toc->last_session_number) {
	switch (point) {
	case CUEIFY_FULL_TOC_FIRST_TRACK_PSEUDOTRACK:
	    return toc->sessions[session].pseudotracks[1].atime;
	case CUEIFY_FULL_TOC_LAST_TRACK_PSEUDOTRACK:
	    return toc->sessions[session].pseudotracks[2].atime;
	case CUEIFY_LEAD_OUT_TRACK:
	    return toc->sessions[session].pseudotracks[0].atime;
	default:
	    return zero;
	}
    } else {
	return zero;
    }
}